

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall
Saturation::SaturationAlgorithm::onClauseReduction
          (SaturationAlgorithm *this,Clause *cl,Clause **replacements,uint numOfReplacements,
          Clause *premise,bool forward)

{
  VirtualIterator<Kernel::Clause_*> *in_RSI;
  long in_R8;
  byte in_R9B;
  ClauseIterator premises;
  bool in_stack_000000af;
  ClauseIterator *in_stack_000000b0;
  uint in_stack_000000bc;
  Clause **in_stack_000000c0;
  Clause *in_stack_000000c8;
  SaturationAlgorithm *in_stack_000000d0;
  VirtualIterator<Kernel::Clause_*> *in_stack_ffffffffffffff60;
  VirtualIterator<Kernel::Clause_*> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SingletonIterator<Kernel::Clause_*> in_stack_ffffffffffffff90;
  VirtualIterator<Kernel::Clause_*> local_38;
  byte local_29;
  long local_28;
  VirtualIterator<Kernel::Clause_*> *local_10;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_10 = in_RSI;
  Lib::VirtualIterator<Kernel::Clause_*>::VirtualIterator(&local_38);
  if (local_28 == 0) {
    Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
    Lib::VirtualIterator<Kernel::Clause_*>::operator=
              ((VirtualIterator<Kernel::Clause_*> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(in_stack_ffffffffffffff60);
  }
  else {
    Lib::getSingletonIterator<Kernel::Clause*>((Clause *)0xacf89a);
    Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(in_stack_ffffffffffffff90);
    Lib::VirtualIterator<Kernel::Clause_*>::operator=
              ((VirtualIterator<Kernel::Clause_*> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(in_stack_ffffffffffffff60);
  }
  Lib::VirtualIterator<Kernel::Clause_*>::VirtualIterator
            ((VirtualIterator<Kernel::Clause_*> *)&stack0xffffffffffffff90,&local_38);
  onClauseReduction(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,
                    in_stack_000000b0,in_stack_000000af);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(local_10);
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(local_10);
  return;
}

Assistant:

void SaturationAlgorithm::onClauseReduction(Clause* cl, Clause **replacements, unsigned numOfReplacements,
                                            Clause* premise, bool forward)
{
  ASS(cl);

  ClauseIterator premises;

  if (premise) {
    premises = pvi(getSingletonIterator(premise));
  }
  else {
    premises = ClauseIterator::getEmpty();
  }

  onClauseReduction(cl, replacements, numOfReplacements, premises, forward);
}